

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_4::checkOpenEXRFile(char *fileName,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  byte in_CL;
  bool in_stack_00000066;
  bool in_stack_00000067;
  char *in_stack_00000068;
  bool in_stack_0000020e;
  bool in_stack_0000020f;
  char **in_stack_00000210;
  undefined1 local_1;
  
  if ((in_CL & 1) == 0) {
    local_1 = (anonymous_namespace)::runChecks<char_const*>
                        (in_stack_00000210,in_stack_0000020f,in_stack_0000020e);
  }
  else {
    local_1 = anon_unknown_0::runCoreChecks(in_stack_00000068,in_stack_00000067,in_stack_00000066);
  }
  return local_1;
}

Assistant:

bool
checkOpenEXRFile (
    const char* fileName, bool reduceMemory, bool reduceTime, bool runCoreCheck)
{

    if (runCoreCheck)
    {
        return runCoreChecks (fileName, reduceMemory, reduceTime);
    }
    else { return runChecks (fileName, reduceMemory, reduceTime); }
}